

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_2003e3::HandleIsPrefixCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  const_reference arg;
  ulong uVar6;
  cmMakefile *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  cmCMakePath local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  cmCMakePath local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  cmCMakePath local_1a0;
  cmCMakePath local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  cmCMakePath local_130;
  cmCMakePath local_108;
  byte local_da;
  allocator<char> local_d9;
  undefined1 local_d8 [6];
  bool isPrefix;
  const_reference local_b8;
  value_type *output;
  value_type *input;
  undefined1 local_a0 [8];
  string inputPath;
  string local_78;
  byte local_55;
  NormalizeOption arguments;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (3 < sVar4) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (sVar4 < 6) {
      if ((anonymous_namespace)::
          HandleIsPrefixCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::parser == '\0') {
        iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleIsPrefixCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser);
        if (iVar3 != 0) {
          NormalizeParser::NormalizeParser(&HandleIsPrefixCommand::parser);
          __cxa_atexit(NormalizeParser::~NormalizeParser,&HandleIsPrefixCommand::parser,
                       &__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               HandleIsPrefixCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::parser);
        }
      }
      local_55 = (byte)CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::Parse<2>
                                 (&HandleIsPrefixCommand::parser.
                                   super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>
                                  ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local);
      pvVar5 = (anonymous_namespace)::
               CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::GetInputs_abi_cxx11_
                         ((CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                          &HandleIsPrefixCommand::parser);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar5);
      pcVar1 = local_20;
      if (sVar4 == 2) {
        std::__cxx11::string::string((string *)local_a0);
        arg = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,1);
        bVar2 = getInputPath(arg,local_20,(string *)local_a0);
        if (bVar2) {
          pvVar5 = (anonymous_namespace)::
                   CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                   GetInputs_abi_cxx11_
                             ((CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                              &HandleIsPrefixCommand::parser);
          output = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::front(pvVar5);
          pvVar5 = (anonymous_namespace)::
                   CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                   GetInputs_abi_cxx11_
                             ((CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                              &HandleIsPrefixCommand::parser);
          local_b8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::back(pvVar5);
          uVar6 = std::__cxx11::string::empty();
          pcVar1 = local_20;
          if ((uVar6 & 1) == 0) {
            if ((local_55 & 1) == 0) {
              std::__cxx11::string::string((string *)&local_208,(string *)local_a0);
              cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                        (&local_1e8,&local_208,generic_format);
              std::__cxx11::string::string((string *)&local_250,(string *)output);
              cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                        (&local_230,&local_250,generic_format);
              local_da = cmCMakePath::IsPrefix(&local_1e8,&local_230);
              cmCMakePath::~cmCMakePath(&local_230);
              std::__cxx11::string::~string((string *)&local_250);
              cmCMakePath::~cmCMakePath(&local_1e8);
              std::__cxx11::string::~string((string *)&local_208);
            }
            else {
              std::__cxx11::string::string((string *)&local_150,(string *)local_a0);
              cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                        (&local_130,&local_150,generic_format);
              cmCMakePath::Normal(&local_108,&local_130);
              std::__cxx11::string::string((string *)&local_1c0,(string *)output);
              cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                        (&local_1a0,&local_1c0,generic_format);
              cmCMakePath::Normal(&local_178,&local_1a0);
              local_da = cmCMakePath::IsPrefix(&local_108,&local_178);
              cmCMakePath::~cmCMakePath(&local_178);
              cmCMakePath::~cmCMakePath(&local_1a0);
              std::__cxx11::string::~string((string *)&local_1c0);
              cmCMakePath::~cmCMakePath(&local_108);
              cmCMakePath::~cmCMakePath(&local_130);
              std::__cxx11::string::~string((string *)&local_150);
            }
            this = cmExecutionStatus::GetMakefile(local_20);
            cmMakefile::AddDefinitionBool(this,local_b8,(bool)(local_da & 1));
            args_local._7_1_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_d8,"Invalid name for output variable.",&local_d9);
            cmExecutionStatus::SetError(pcVar1,(string *)local_d8);
            std::__cxx11::string::~string((string *)local_d8);
            std::allocator<char>::~allocator(&local_d9);
            args_local._7_1_ = 0;
          }
        }
        else {
          args_local._7_1_ = 0;
        }
        input._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_a0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"IS_PREFIX called with unexpected arguments.",
                   (allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
        cmExecutionStatus::SetError(pcVar1,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
        args_local._7_1_ = 0;
      }
      goto LAB_00241e76;
    }
  }
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"IS_PREFIX must be called with three or four arguments.",&local_41)
  ;
  cmExecutionStatus::SetError(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  args_local._7_1_ = 0;
LAB_00241e76:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleIsPrefixCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 4 || args.size() > 5) {
    status.SetError("IS_PREFIX must be called with three or four arguments.");
    return false;
  }

  static NormalizeParser const parser;

  const auto arguments = parser.Parse(args);

  if (parser.GetInputs().size() != 2) {
    status.SetError("IS_PREFIX called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  const auto& input = parser.GetInputs().front();
  const auto& output = parser.GetInputs().back();

  if (output.empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  bool isPrefix;
  if (arguments.Normalize) {
    isPrefix =
      cmCMakePath(inputPath).Normal().IsPrefix(cmCMakePath(input).Normal());
  } else {
    isPrefix = cmCMakePath(inputPath).IsPrefix(input);
  }

  status.GetMakefile().AddDefinitionBool(output, isPrefix);

  return true;
}